

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParseCertificatePoliciesExtensionTest_TwoPoliciesWithQualifiers_Test::TestBody
          (ParseCertificatePoliciesExtensionTest_TwoPoliciesWithQualifiers_Test *this)

{
  pointer pPVar1;
  undefined8 *puVar2;
  string sVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  pointer *__ptr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  CertErrors *in_R8;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  Input extension_value;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> policies;
  CertErrors errors;
  string der;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  Input local_b8;
  undefined1 local_a8 [8];
  undefined2 uStack_a0;
  undefined1 uStack_9e;
  undefined5 uStack_9d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_98;
  AssertHelper local_80;
  undefined1 local_78 [8];
  pointer pPStack_70;
  pointer local_68;
  CertErrors local_60;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_a8 = (undefined1  [8])&aStack_98;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"policy_1_2_3_and_1_2_4_with_qualifiers.pem","");
  LoadTestData((anon_unknown_0 *)local_78,(string *)local_a8,&local_48);
  if (local_a8 != (undefined1  [8])&aStack_98) {
    operator_delete((void *)local_a8,
                    CONCAT53(aStack_98._M_allocated_capacity._3_5_,
                             CONCAT12(aStack_98._M_local_buf[2],
                                      aStack_98._M_allocated_capacity._0_2_)) + 1);
  }
  if (local_78[0] == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_78,
               (AssertionResult *)
               "LoadTestData(\"policy_1_2_3_and_1_2_4_with_qualifiers.pem\", &der)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x11f,(char *)local_a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_a8 != (undefined1  [8])&aStack_98) {
      operator_delete((void *)local_a8,
                      CONCAT53(aStack_98._M_allocated_capacity._3_5_,
                               CONCAT12(aStack_98._M_local_buf[2],
                                        aStack_98._M_allocated_capacity._0_2_)) + 1);
    }
    if (local_60.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_60.nodes_.
                            super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (pPStack_70 != (pointer)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pPStack_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPStack_70);
    }
    goto LAB_0021af36;
  }
  if (pPStack_70 != (pointer)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pPStack_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPStack_70);
  }
  local_78 = (undefined1  [8])0x0;
  pPStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  CertErrors::CertErrors(&local_60);
  extension_value.data_.size_ = (size_t)local_78;
  extension_value.data_.data_ = (uchar *)local_48._M_string_length;
  bVar5 = ParseCertificatePoliciesExtension
                    ((bssl *)local_48._M_dataplus._M_p,extension_value,
                     (vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> *)
                     &local_60,in_R8);
  local_c8[0] = (internal)bVar5;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,
               (AssertionResult *)
               "ParseCertificatePoliciesExtension(StringAsBytes(der), &policies, &errors)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x123,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_a8 != (undefined1  [8])&aStack_98) {
      operator_delete((void *)local_a8,
                      CONCAT53(aStack_98._M_allocated_capacity._3_5_,
                               CONCAT12(aStack_98._M_local_buf[2],
                                        aStack_98._M_allocated_capacity._0_2_)) + 1);
    }
    if ((internal *)local_b8.data_.data_ != (internal *)0x0) {
      (**(code **)(*(long *)local_b8.data_.data_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_b8.data_.data_ = (uchar *)CONCAT44(local_b8.data_.data_._4_4_,2);
  local_c8 = (undefined1  [8])(((long)pPStack_70 - (long)local_78 >> 3) * -0x3333333333333333);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"2U","policies.size()",(uint *)&local_b8,(unsigned_long *)local_c8
            );
  if (local_a8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_c8);
    puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (puVar2 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*puVar2;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
               ,0x124,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
LAB_0021aef5:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&uStack_a0;
LAB_0021af1d:
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,pbVar6);
    }
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,pbVar6);
    }
    auVar4 = local_78;
    local_c8 = (undefined1  [8])&(anonymous_namespace)::policy_1_2_3_der;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_a8,"der::Input(policy_1_2_3_der)","policy.policy_oid",
               (Input *)local_c8,(Input *)local_78);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_c8);
      puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (puVar2 == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (char *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x127,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,pbVar6);
    }
    local_b8.data_.data_ = (uchar *)CONCAT44(local_b8.data_.data_._4_4_,1);
    local_c8 = (undefined1  [8])
               ((long)(((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                         *)((long)auVar4 + 0x10))->
                      super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                         *)((long)auVar4 + 0x10))->
                      super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_a8,"1U","policy.policy_qualifiers.size()",(uint *)&local_b8,
               (unsigned_long *)local_c8);
    sVar3 = local_a8[0];
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_c8);
      puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (puVar2 == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (char *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x128,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
      goto LAB_0021aef5;
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,pbVar6);
    }
    pPVar1 = (((vector<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_> *)
              ((long)auVar4 + 0x10))->
             super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c8 = (undefined1  [8])0x53d271;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000008;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_a8,"der::Input(kCpsPointerId)","qualifier.qualifier_oid",
               (Input *)local_c8,&pPVar1->qualifier_oid);
    if (local_a8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_c8);
      puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (puVar2 == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (char *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x12a,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,pbVar6);
    }
    aStack_98._M_allocated_capacity._0_2_ = 0x2e65;
    aStack_98._M_local_buf[2] = 'c';
    aStack_98._M_allocated_capacity._3_5_ = 0x5f312f6d6f;
    aStack_98._8_2_ = 0x5f32;
    aStack_98._M_local_buf[10] = '3';
    local_a8 = (undefined1  [8])0x3a73707474681916;
    uStack_a0 = 0x2f2f;
    uStack_9e = 0x65;
    uStack_9d = 0x6c706d6178;
    local_b8.data_.size_ = 0x1b;
    local_b8.data_.data_ = (uchar *)local_a8;
    testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
              ((internal *)local_c8,"der::Input(kExpectedQualifier)","qualifier.qualifier",&local_b8
               ,&pPVar1->qualifier);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                 ,0x130,pcVar7);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((internal *)local_b8.data_.data_ != (internal *)0x0) {
        (**(code **)(*(long *)local_b8.data_.data_ + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    auVar4 = local_78;
    if (sVar3 != (string)0x0) {
      local_c8 = (undefined1  [8])&(anonymous_namespace)::policy_1_2_4_der;
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_a8,"der::Input(policy_1_2_4_der)","policy.policy_oid",
                 (Input *)local_c8,(Input *)((long)local_78 + 0x28));
      if (local_a8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_c8);
        puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
        if (puVar2 == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (char *)*puVar2;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x134,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_c8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c8 + 8))();
        }
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,pbVar6);
      }
      local_b8.data_.data_ = (uchar *)CONCAT44(local_b8.data_.data_._4_4_,1);
      local_c8 = (undefined1  [8])
                 ((long)(((pointer)((long)auVar4 + 0x28))->policy_qualifiers).
                        super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(((pointer)((long)auVar4 + 0x28))->policy_qualifiers).
                        super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_a8,"1U","policy.policy_qualifiers.size()",(uint *)&local_b8,
                 (unsigned_long *)local_c8);
      if (local_a8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_c8);
        puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
        if (puVar2 == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (char *)*puVar2;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x135,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
        goto LAB_0021aef5;
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,pbVar6);
      }
      pPVar1 = (((pointer)((long)auVar4 + 0x28))->policy_qualifiers).
               super__Vector_base<bssl::PolicyQualifierInfo,_std::allocator<bssl::PolicyQualifierInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c8 = (undefined1  [8])0x53d271;
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000008;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_a8,"der::Input(kCpsPointerId)","qualifier.qualifier_oid",
                 (Input *)local_c8,&pPVar1->qualifier_oid);
      if (local_a8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_c8);
        puVar2 = (undefined8 *)CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
        if (puVar2 == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (char *)*puVar2;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x137,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_c8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c8 + 8))();
        }
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(uStack_9d,CONCAT12(uStack_9e,uStack_a0));
      if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,pbVar6);
      }
      aStack_98._M_allocated_capacity._0_2_ = 0x632e;
      aStack_98._M_local_buf[2] = 'o';
      aStack_98._M_allocated_capacity._3_5_ = 0x325f312f6d;
      aStack_98._8_2_ = 0x345f;
      local_a8 = (undefined1  [8])0x2f3a707474681816;
      uStack_a0 = 0x652f;
      uStack_9e = 0x78;
      uStack_9d = 0x656c706d61;
      local_b8.data_.size_ = 0x1a;
      local_b8.data_.data_ = (uchar *)local_a8;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_c8,"der::Input(kExpectedQualifier)","qualifier.qualifier",
                 &local_b8,&pPVar1->qualifier);
      if (local_c8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_c0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/certificate_policies_unittest.cc"
                   ,0x13d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((internal *)local_b8.data_.data_ != (internal *)0x0) {
          (**(code **)(*(long *)local_b8.data_.data_ + 8))();
        }
      }
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0021af22;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0;
      pbVar6 = local_c0;
      goto LAB_0021af1d;
    }
  }
LAB_0021af22:
  CertErrors::~CertErrors(&local_60);
  ::std::vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_>::~vector
            ((vector<bssl::PolicyInformation,_std::allocator<bssl::PolicyInformation>_> *)local_78);
LAB_0021af36:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, TwoPolicies) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_and_1_2_4.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(2U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
  EXPECT_EQ(der::Input(policy_1_2_4_der), policies[1]);
}